

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_split_ratio(REF_INT number_of_partitions,REF_DBL *ratio)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (double)number_of_partitions * 1e+20;
  if (dVar1 <= -dVar1) {
    dVar1 = -dVar1;
  }
  dVar2 = (double)(number_of_partitions / 2);
  dVar3 = dVar2;
  if (number_of_partitions < 2) {
    dVar3 = -dVar2;
  }
  *ratio = (REF_DBL)(-(ulong)(dVar3 < dVar1) & (ulong)(dVar2 / (double)number_of_partitions));
  return (uint)(dVar1 <= dVar3) << 2;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_split_ratio(REF_INT number_of_partitions,
                                           REF_DBL *ratio) {
  REF_INT half = number_of_partitions / 2;
  if (ref_math_divisible((REF_DBL)half, (REF_DBL)number_of_partitions)) {
    *ratio = (REF_DBL)half / (REF_DBL)number_of_partitions;
  } else {
    *ratio = 0;
    return REF_DIV_ZERO;
  }
  return REF_SUCCESS;
}